

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O2

void class5(int *ip)

{
  uint data;
  int iVar1;
  
  loccnt = loccnt + 3;
  iVar1 = getoperand(ip,4,0x2c);
  data = value;
  if (iVar1 != 0) {
    iVar1 = getoperand(ip,0x100,0x3b);
    if ((iVar1 != 0) && (pass == 1)) {
      putbyte(data_loccnt,opval);
      putbyte(data_loccnt + 1,data);
      iVar1 = value - (page * 0x2000 + loccnt);
      if ((char)iVar1 != iVar1) {
        error("Branch address out of range!");
        return;
      }
      putbyte(data_loccnt + 2,iVar1);
      println();
      return;
    }
  }
  return;
}

Assistant:

void
class5(int *ip)
{
	int	zp;
	unsigned int addr;
	int mode;

	/* update location counter */
	loccnt += 3;

	/* get first operand */
	mode = getoperand(ip, ZP, ',');
	zp   = value;
	if (!mode)
		return;

	/* get second operand */
	mode = getoperand(ip, ABS, ';');
	if (!mode)
		return;

	/* generate code */
	if (pass == LAST_PASS) {
		/* opcodes */
		putbyte(data_loccnt, opval);
		putbyte(data_loccnt+1, zp);

		/* calculate branch offset */
		addr = value - (loccnt + (page << 13));

		/* check range */
		if (addr > 0x7F && addr < 0xFFFFFF80) {
			error("Branch address out of range!");
			return;
		}

		/* offset */
		putbyte(data_loccnt+2, addr);

		/* output line */
		println();
	}
}